

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O2

void __thiscall
MakefileGenerator::callExtraCompilerDependCommand
          (MakefileGenerator *this,ProString *extraCompiler,QString *tmp_dep_cmd,QString *inpf,
          QString *tmp_out,bool dep_lines,QStringList *deps,bool existingDepsOnly,
          bool checkCommandAvailability)

{
  long lVar1;
  Data *pDVar2;
  long lVar3;
  QString file;
  QString file_00;
  bool bVar4;
  int iVar5;
  qsizetype qVar6;
  FILE *__stream;
  size_t sVar7;
  pointer pQVar8;
  ulong uVar9;
  QString *s2;
  char16_t *pcVar10;
  uint uVar11;
  long lVar12;
  long in_FS_OFFSET;
  undefined8 in_stack_fffffffffffffd28;
  MakefileGenerator *this_00;
  char cVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  QArrayDataPointer<char16_t> local_2b8;
  QArrayDataPointer<char16_t> local_2a0;
  QDir outDir;
  QArrayDataPointer<char16_t> local_270;
  QArrayDataPointer<char16_t> local_258;
  QStringBuilder<QLatin1String,_QString> local_238;
  QStringBuilder<QStringBuilder<QLatin1String,_QString>,_QLatin1String> local_208;
  QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString>,_QLatin1String>,_QString>
  local_1c8;
  QArrayDataPointer<QString> local_178;
  QArrayDataPointer<char16_t> local_158;
  char buff [256];
  
  uVar11 = (uint)dep_lines;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memset(buff,0xaa,0x100);
  local_158.size = 0xaaaaaaaaaaaaaaaa;
  local_158.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_158.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  replaceExtraCompilerVariables((QString *)&local_158,this,tmp_dep_cmd,inpf,tmp_out,LocalShell);
  if (checkCommandAvailability) {
    bVar4 = canExecute(this,(QString *)&local_158);
    if (!bVar4) goto LAB_0014ee91;
  }
  qVar6 = QtPrivate::lengthHelperPointer<char>("cd ");
  Option::fixPathToLocalOS((QString *)&local_270,&Option::output_dir,false,true);
  QMakeInternal::IoUtils::shellQuoteUnix((QString *)&local_258,(QString *)&local_270);
  local_238.b.d.size = local_258.size;
  local_238.b.d.ptr = local_258.ptr;
  local_238.b.d.d = local_258.d;
  local_238.a.m_data = "cd ";
  local_258.d = (Data *)0x0;
  local_258.ptr = (char16_t *)0x0;
  local_258.size = 0;
  local_238.a.m_size = qVar6;
  qVar6 = QtPrivate::lengthHelperPointer<char>(" && ");
  QStringBuilder<QLatin1String,_QString>::QStringBuilder(&local_208.a,&local_238);
  local_208.b.m_data = " && ";
  local_208.b.m_size = qVar6;
  fixEnvVariables((QString *)&outDir,(QString *)&local_158);
  QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString>,_QLatin1String>,_QString>::
  QStringBuilder(&local_1c8,&local_208,(QString *)&outDir);
  QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString>,_QLatin1String>,_QString>::
  convertTo<QString>((QString *)&local_178,&local_1c8);
  qVar6 = local_158.size;
  pcVar10 = local_158.ptr;
  pDVar2 = local_158.d;
  local_158.d = (Data *)local_178.d;
  local_158.ptr = (char16_t *)local_178.ptr;
  local_178.d = (Data *)pDVar2;
  local_178.ptr = (QString *)pcVar10;
  local_158.size = local_178.size;
  local_178.size = qVar6;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_178);
  QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString>,_QLatin1String>,_QString>::
  ~QStringBuilder(&local_1c8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&outDir);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_208.a.b.d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_238.b.d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_258);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_270);
  QString::toLatin1_helper((QString *)&local_1c8);
  pcVar10 = (char16_t *)local_1c8.a.a.a.m_data;
  if ((char16_t *)local_1c8.a.a.a.m_data == (char16_t *)0x0) {
    pcVar10 = (char16_t *)&QByteArray::_empty;
  }
  __stream = popen((char *)pcVar10,"r");
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_1c8);
  if (__stream != (FILE *)0x0) {
    local_208.a.b.d.d = (Data *)0x0;
    local_208.a.a.m_size = 0;
    local_208.a.a.m_data = (char *)0x0;
    this_00 = this;
    while( true ) {
      iVar5 = feof(__stream);
      cVar13 = (char)uVar11;
      if (iVar5 != 0) break;
      sVar7 = fread(buff,1,0xff,__stream);
      cVar13 = (char)uVar11;
      if ((int)sVar7 == 0) break;
      QByteArray::append((QByteArray *)&local_208,buff,(long)(int)sVar7);
    }
    pclose(__stream);
    local_238.b.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_238.a.m_size = -0x5555555555555556;
    local_238.a.m_data = (char *)0xaaaaaaaaaaaaaaaa;
    QString::fromLocal8Bit<void>((QString *)&local_238,(QByteArray *)&local_208);
    if (local_238.b.d.d != (Data *)0x0) {
      _outDir = (Data *)0xaaaaaaaaaaaaaaaa;
      QDir::QDir(&outDir,(QString *)&Option::output_dir);
      local_178.size = 0xaaaaaaaaaaaaaaaa;
      local_178.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_178.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
      if (cVar13 == '\0') {
        QString::simplified_helper((QString *)&local_1c8);
        QString::split(&local_178,&local_1c8,0x20,0,1);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1c8);
      }
      else {
        local_178.size = 0xaaaaaaaaaaaaaaaa;
        local_178.d = (Data *)0xaaaaaaaaaaaaaaaa;
        local_178.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
        QString::split(&local_178,&local_238,10,1,1);
      }
      lVar12 = 0;
      uVar9 = 0;
      while (uVar9 < (ulong)local_178.size) {
        uVar14 = (undefined4)uVar9;
        uVar15 = (undefined4)(uVar9 >> 0x20);
        pQVar8 = QList<QString>::data((QList<QString> *)&local_178);
        s2 = (QString *)((long)&(pQVar8->d).d + lVar12);
        local_1c8.a.a.b.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
        local_1c8.a.a.a.m_size = -0x5555555555555556;
        local_1c8.a.a.a.m_data = (char *)0xaaaaaaaaaaaaaaaa;
        QDir::absoluteFilePath((QString *)&local_1c8);
        bVar4 = comparesEqual((QString *)&local_1c8,s2);
        if (!bVar4) {
          local_2a0.d = (Data *)local_1c8.a.a.a.m_size;
          local_2a0.ptr = (char16_t *)local_1c8.a.a.a.m_data;
          local_2a0.size = (qsizetype)local_1c8.a.a.b.d.d;
          if ((Data *)local_1c8.a.a.a.m_size != (Data *)0x0) {
            LOCK();
            (((QArrayData *)local_1c8.a.a.a.m_size)->ref_)._q_value.super___atomic_base<int>._M_i =
                 (((QArrayData *)local_1c8.a.a.a.m_size)->ref_)._q_value.super___atomic_base<int>.
                 _M_i + 1;
            UNLOCK();
          }
          file.d.ptr = (char16_t *)this_00;
          file.d.d = (Data *)in_stack_fffffffffffffd28;
          file.d.size._0_4_ = uVar14;
          file.d.size._4_4_ = uVar15;
          bVar4 = exists(this,file);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2a0);
          if (bVar4) {
            QString::operator=(s2,(QString *)&local_1c8);
          }
          else {
            local_258.size = -0x5555555555555556;
            local_258.d = (Data *)0xaaaaaaaaaaaaaaaa;
            local_258.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
            resolveDependency((QString *)&local_258,this,&outDir,s2);
            if (local_258.size == 0) {
              local_2b8.d = *(Data **)((long)&(pQVar8->d).d + lVar12);
              local_2b8.ptr = *(char16_t **)((long)&(pQVar8->d).ptr + lVar12);
              local_2b8.size = *(qsizetype *)((long)&(pQVar8->d).size + lVar12);
              if (local_2b8.d != (Data *)0x0) {
                LOCK();
                ((local_2b8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_2b8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                     1;
                UNLOCK();
              }
              file_00.d.ptr = (char16_t *)this_00;
              file_00.d.d = (Data *)in_stack_fffffffffffffd28;
              file_00.d.size._0_4_ = uVar14;
              file_00.d.size._4_4_ = uVar15;
              bVar4 = exists(this_00,file_00);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2b8);
              if (bVar4) {
                ProString::toLatin1((QByteArray *)&local_270,extraCompiler);
                pcVar10 = local_270.ptr;
                if (local_270.ptr == (char16_t *)0x0) {
                  pcVar10 = (char16_t *)&QByteArray::_empty;
                }
                warn_msg(WarnDeprecated,
                         ".depend_command for extra compiler %s prints paths relative to source directory"
                         ,pcVar10);
                QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_270);
                this = this_00;
              }
              else if (existingDepsOnly) {
                QString::clear(s2);
                this = this_00;
              }
              else {
                QString::operator=(s2,(QString *)&local_1c8);
                this = this_00;
              }
            }
            else {
              QString::operator=(s2,(QString *)&local_258);
              this = this_00;
            }
            this_00 = this;
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_258);
          }
        }
        if (*(long *)((long)&(pQVar8->d).size + lVar12) != 0) {
          fileFixify((QString *)&local_258,this,s2,(FileFixifyTypes)0x0,true);
          pDVar2 = *(Data **)((long)&(pQVar8->d).d + lVar12);
          *(Data **)((long)&(pQVar8->d).d + lVar12) = local_258.d;
          pcVar10 = *(char16_t **)((long)&(pQVar8->d).ptr + lVar12);
          *(char16_t **)((long)&(pQVar8->d).ptr + lVar12) = local_258.ptr;
          lVar3 = *(long *)((long)&(pQVar8->d).size + lVar12);
          *(qsizetype *)((long)&(pQVar8->d).size + lVar12) = local_258.size;
          local_258.d = pDVar2;
          local_258.ptr = pcVar10;
          local_258.size = lVar3;
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_258);
        }
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1c8);
        lVar12 = lVar12 + 0x18;
        uVar9 = CONCAT44(uVar15,uVar14) + 1;
      }
      QList<QString>::append(deps,(QList<QString> *)&local_178);
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_178);
      QDir::~QDir(&outDir);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_238);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_208);
  }
LAB_0014ee91:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_158);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void MakefileGenerator::callExtraCompilerDependCommand(const ProString &extraCompiler,
                                                       const QString &tmp_dep_cmd,
                                                       const QString &inpf,
                                                       const QString &tmp_out,
                                                       bool dep_lines,
                                                       QStringList *deps,
                                                       bool existingDepsOnly,
                                                       bool checkCommandAvailability)
{
    char buff[256];
    QString dep_cmd = replaceExtraCompilerVariables(tmp_dep_cmd, inpf, tmp_out, LocalShell);
    if (checkCommandAvailability && !canExecute(dep_cmd))
        return;
    dep_cmd = QLatin1String("cd ")
            + IoUtils::shellQuote(Option::fixPathToLocalOS(Option::output_dir, false))
            + QLatin1String(" && ")
            + fixEnvVariables(dep_cmd);
    if (FILE *proc = QT_POPEN(dep_cmd.toLatin1().constData(), QT_POPEN_READ)) {
        QByteArray depData;
        while (int read_in = feof(proc) ? 0 : (int)fread(buff, 1, 255, proc))
            depData.append(buff, read_in);
        QT_PCLOSE(proc);
        const QString indeps = QString::fromLocal8Bit(depData);
        if (indeps.isEmpty())
            return;
        QDir outDir(Option::output_dir);
        QStringList dep_cmd_deps = splitDeps(indeps, dep_lines);
        for (int i = 0; i < dep_cmd_deps.size(); ++i) {
            QString &file = dep_cmd_deps[i];
            const QString absFile = outDir.absoluteFilePath(file);
            if (absFile == file) {
                // already absolute; don't do any checks.
            } else if (exists(absFile)) {
                file = absFile;
            } else {
                const QString localFile = resolveDependency(outDir, file);
                if (localFile.isEmpty()) {
                    if (exists(file)) {
                        warn_msg(WarnDeprecated, ".depend_command for extra compiler %s"
                                 " prints paths relative to source directory",
                                 extraCompiler.toLatin1().constData());
                    } else if (existingDepsOnly) {
                        file.clear();
                    } else {
                        file = absFile;  // fallback for generated resources
                    }
                } else {
                    file = localFile;
                }
            }
            if (!file.isEmpty())
                file = fileFixify(file);
        }
        deps->append(dep_cmd_deps);
    }
}